

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool IsOnLeft(expr_node *node)

{
  expr_node *node_local;
  bool local_1;
  
  if (node->parent == (expr_node *)0x0) {
    local_1 = false;
  }
  else if (node->parent->left == node) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool IsOnLeft(const expr_node* node)
{
    if (node->parent == nullptr)
        return false;
    else if (node->parent->left == node)
        return true;
    else
        return false;
}